

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar1,pcVar1 + s->_M_string_length)
  ;
  if (local_60 < 4) {
    bVar3 = false;
  }
  else {
    iVar2 = strcmp((char *)((long)local_68 + (local_60 - 4)),"/bin");
    bVar3 = iVar2 == 0;
  }
  bVar4 = true;
  if (!bVar3) {
    local_48 = local_38;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + s->_M_string_length);
    if (local_40 < 5) {
      bVar4 = false;
    }
    else {
      iVar2 = strcmp((char *)((long)local_48 + (local_40 - 5)),"/sbin");
      bVar4 = iVar2 == 0;
    }
  }
  if ((!bVar3) && (local_48 != local_38)) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (bVar4) {
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if((cmHasLiteralSuffix(s, "/bin")) ||
     (cmHasLiteralSuffix(s, "/sbin")))
    {
    return cmSystemTools::GetFilenamePath(s);
    }
  else
    {
    return s;
    }
}